

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.c
# Opt level: O0

size_t union_uint32_card(uint32_t *set_1,size_t size_1,uint32_t *set_2,size_t size_2)

{
  ulong uVar1;
  size_t n_elems_1;
  size_t n_elems;
  uint32_t val_2;
  uint32_t val_1;
  size_t idx_2;
  size_t idx_1;
  size_t pos;
  size_t size_2_local;
  uint32_t *set_2_local;
  size_t size_1_local;
  uint32_t *set_1_local;
  size_t local_8;
  
  pos = 0;
  idx_1 = 0;
  idx_2 = 0;
  local_8 = size_1;
  if ((size_2 == 0) || (local_8 = size_2, size_1 == 0)) {
    return local_8;
  }
  val_1 = *set_1;
  val_2 = *set_2;
  do {
    if (val_1 < val_2) {
      idx_1 = idx_1 + 1;
      uVar1 = idx_2;
      if (size_1 <= idx_1) goto LAB_0010f4e5;
      val_1 = set_1[idx_1];
    }
    else {
      if (val_2 < val_1) {
        uVar1 = idx_2 + 1;
        if (size_2 <= uVar1) goto LAB_0010f4e5;
        val_2 = set_2[uVar1];
      }
      else {
        idx_1 = idx_1 + 1;
        uVar1 = idx_2 + 1;
        if ((size_1 <= idx_1) || (size_2 <= uVar1)) {
LAB_0010f4e5:
          idx_2 = uVar1;
          pos = pos + 1;
          if (idx_1 < size_1) {
            pos = (size_1 - idx_1) + pos;
          }
          else if (idx_2 < size_2) {
            pos = (size_2 - idx_2) + pos;
          }
          return pos;
        }
        val_1 = set_1[idx_1];
        val_2 = set_2[uVar1];
      }
      idx_2 = idx_2 + 1;
    }
    pos = pos + 1;
  } while( true );
}

Assistant:

size_t union_uint32_card(const uint32_t *set_1, size_t size_1,
                         const uint32_t *set_2, size_t size_2) {
    size_t pos = 0, idx_1 = 0, idx_2 = 0;

    if (0 == size_2) {
        return size_1;
    }
    if (0 == size_1) {
        return size_2;
    }

    uint32_t val_1 = set_1[idx_1], val_2 = set_2[idx_2];

    while (true) {
        if (val_1 < val_2) {
            ++idx_1;
            ++pos;
            if (idx_1 >= size_1) break;
            val_1 = set_1[idx_1];
        } else if (val_2 < val_1) {
            ++idx_2;
            ++pos;
            if (idx_2 >= size_2) break;
            val_2 = set_2[idx_2];
        } else {
            ++idx_1;
            ++idx_2;
            ++pos;
            if (idx_1 >= size_1 || idx_2 >= size_2) break;
            val_1 = set_1[idx_1];
            val_2 = set_2[idx_2];
        }
    }

    if (idx_1 < size_1) {
        const size_t n_elems = size_1 - idx_1;
        pos += n_elems;
    } else if (idx_2 < size_2) {
        const size_t n_elems = size_2 - idx_2;
        pos += n_elems;
    }
    return pos;
}